

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O0

void r4vec_print(int n,float *a,string *title)

{
  _Setw _Var1;
  ostream *poVar2;
  int local_24;
  int i;
  string *title_local;
  float *a_local;
  int n_local;
  
  std::operator<<((ostream *)&std::cout,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)title);
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)&std::cout,"\n");
  for (local_24 = 0; local_24 < n; local_24 = local_24 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"  ");
    _Var1 = std::setw(8);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_24);
    poVar2 = std::operator<<(poVar2,": ");
    _Var1 = std::setw(0xe);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,a[local_24]);
    std::operator<<(poVar2,"\n");
  }
  return;
}

Assistant:

void r4vec_print ( int n, float a[], string title )

//****************************************************************************80
//
//  Purpose:
//
//    R4VEC_PRINT prints an R4VEC.
//
//  Discussion:
//
//    An R4VEC is a vector of R4's.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 August 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of components of the vector.
//
//    Input, float A[N], the vector to be printed.
//
//    Input, string TITLE, a title.
//
{
  int i;

  cout << "\n";
  cout << title << "\n";
  cout << "\n";
  for ( i = 0; i < n; i++ )
  {
    cout << "  " << setw(8)  << i
         << ": " << setw(14) << a[i]  << "\n";
  }

  return;
}